

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall vec3<unsigned_char>::normalize(vec3<unsigned_char> *this)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  uVar2._0_4_ = (this->super_vec3_base).r;
  uVar2._4_4_ = (this->super_vec3_base).g;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  fVar4 = (this->super_vec3_base).b;
  if (((((float)(undefined4)uVar2 == 128.0) && (!NAN((float)(undefined4)uVar2))) &&
      ((float)uVar2._4_4_ == 128.0)) &&
     (((!NAN((float)uVar2._4_4_) && (fVar4 == 128.0)) && (!NAN(fVar4))))) {
    return;
  }
  auVar6 = divps(auVar6,_DAT_0016a530);
  (this->super_vec3_base).r = auVar6._0_4_ + auVar6._0_4_ + -1.0;
  (this->super_vec3_base).g = auVar6._4_4_ + auVar6._4_4_ + -1.0;
  (this->super_vec3_base).b = fVar4 / 255.0 + fVar4 / 255.0 + -1.0;
  vec3_base::clamp(&this->super_vec3_base,-1.0,1.0);
  vec3_base::base_normalize(&this->super_vec3_base);
  uVar1 = (this->super_vec3_base).r;
  uVar3 = (this->super_vec3_base).g;
  fVar4 = floorf(((float)uVar1 + 1.0) * 255.0 * 0.5 + 0.5);
  fVar5 = floorf(((float)uVar3 + 1.0) * 255.0 * 0.5 + 0.5);
  (this->super_vec3_base).r = fVar4;
  (this->super_vec3_base).g = fVar5;
  fVar4 = floorf(((this->super_vec3_base).b + 1.0) * 255.0 * 0.5 + 0.5);
  (this->super_vec3_base).b = fVar4;
  vec3_base::clamp(&this->super_vec3_base,0.0,255.0);
  return;
}

Assistant:

void normalize() {
        // Zero normals in range [-1, 1] can't be normalized
        if (gc_m[i] == r && gc_m[i] == g && gc_m[i] == b) {
            return;
        } else {
            r = (float)(r / (double)gc_s[i]) * 2.0f - 1.0f;
            g = (float)(g / (double)gc_s[i]) * 2.0f - 1.0f;
            b = (float)(b / (double)gc_s[i]) * 2.0f - 1.0f;
            clamp(-1.0f, 1.0f);
            base_normalize();
            r = (std::floor((r + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            g = (std::floor((g + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            b = (std::floor((b + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            clamp(0.0f, (float)gc_s[i]);
        }
    }